

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastGtR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  int v1;
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  uint32_t uVar4;
  TcParseTableBase *pTVar5;
  bool bVar6;
  uint uVar7;
  MessageLite *pMVar8;
  ulong uVar9;
  string *psVar10;
  char *pcVar11;
  uint *puVar12;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 offset;
  size_type sVar13;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar14;
  RepeatedPtrFieldBase *ptr_00;
  pointer pcVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  RepeatedPtrFieldBase local_60;
  TcParseTableBase *local_48;
  RepeatedPtrFieldBase *local_40;
  TcParseTableBase *local_38;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar11 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar11;
  }
  bVar3 = *ptr;
  pTVar5 = *(TcParseTableBase **)
            ((long)&table->has_bits_offset +
            ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  offset = data.field_0 >> 0x30;
  local_40 = RefAt<google::protobuf::internal::RepeatedPtrFieldBase>(msg,offset.data);
  local_48 = pTVar5 + 1;
  local_60.arena_._4_4_ = (uint)bVar3;
  local_38 = pTVar5;
  while( true ) {
    ptr_00 = local_40;
    pMVar8 = AddMessage(local_38,local_40);
    pTVar5 = local_48;
    auVar17._8_8_ = extraout_RDX;
    auVar17._0_8_ = local_60.tagged_rep_or_elem_;
    iVar16 = ctx->depth_;
    v1 = iVar16 + -1;
    ctx->depth_ = v1;
    if (iVar16 < 1) break;
    iVar16 = ctx->group_depth_ + 1;
    ctx->group_depth_ = iVar16;
    local_60.tagged_rep_or_elem_ =
         (RepeatedPtrFieldBase *)((long)&((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_ + 1);
    while( true ) {
      ptr_00 = &local_60;
      bVar6 = ParseContext::Done(ctx,(char **)&local_60);
      auVar17._8_8_ = extraout_RDX_00;
      auVar17._0_8_ = local_60.tagged_rep_or_elem_;
      if (bVar6) break;
      uVar7 = (uint)pTVar5[-1].fast_idx_mask &
              (uint)*(ushort *)(void **)local_60.tagged_rep_or_elem_;
      if ((uVar7 & 7) != 0) goto LAB_00260d39;
      uVar9 = (ulong)(uVar7 & 0xfffffff8);
      offset.data = (ulong)*(ushort *)(void **)local_60.tagged_rep_or_elem_ ^
                    *(ulong *)(&pTVar5->fast_idx_mask + uVar9 * 2);
      auVar17 = (**(code **)(&pTVar5->has_bits_offset + uVar9))
                          (pMVar8,local_60.tagged_rep_or_elem_,ctx,offset.data,pTVar5 + -1,0);
      ptr_00 = (RepeatedPtrFieldBase *)local_60.tagged_rep_or_elem_;
      if ((auVar17._0_8_ == (RepeatedPtrFieldBase *)0x0) ||
         (local_60.tagged_rep_or_elem_ = auVar17._0_8_,
         (ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
    }
    local_60.tagged_rep_or_elem_ = auVar17._0_8_;
    ptr = (char *)local_60.tagged_rep_or_elem_;
    if ((pTVar5[-1].field_0x9 & 1) != 0) {
      ptr_00 = (RepeatedPtrFieldBase *)local_60.tagged_rep_or_elem_;
      auVar18 = (undefined1  [16])
                (*pTVar5[-1].post_loop_handler)(pMVar8,(char *)local_60.tagged_rep_or_elem_,ctx);
      auVar17._8_8_ = auVar18._8_8_;
      auVar17._0_8_ = local_60.tagged_rep_or_elem_;
      ptr = (char *)auVar18._0_8_;
    }
    local_60.tagged_rep_or_elem_ = auVar17._0_8_;
    if ((RepeatedPtrFieldBase *)ptr != (RepeatedPtrFieldBase *)0x0) {
      psVar10 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                          (v1,ctx->depth_,"old_depth == depth_");
      if (psVar10 != (string *)0x0) {
        pcVar15 = (psVar10->_M_dataplus)._M_p;
        sVar13 = psVar10->_M_string_length;
        uVar14 = 0x45b;
LAB_00260d89:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_60,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,uVar14,sVar13,pcVar15);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_60);
      }
      ptr_00 = (RepeatedPtrFieldBase *)(ulong)(uint)ctx->group_depth_;
      psVar10 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                          (iVar16,ctx->group_depth_,"old_group_depth == group_depth_");
      auVar17._8_8_ = extraout_RDX_01;
      auVar17._0_8_ = local_60.tagged_rep_or_elem_;
      if (psVar10 != (string *)0x0) {
        pcVar15 = (psVar10->_M_dataplus)._M_p;
        sVar13 = psVar10->_M_string_length;
        uVar14 = 0x45c;
        goto LAB_00260d89;
      }
    }
    local_60.tagged_rep_or_elem_ = auVar17._0_8_;
    uVar4 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    uVar1 = ctx->depth_;
    uVar2 = ctx->group_depth_;
    ctx->depth_ = uVar1 + 1;
    ctx->group_depth_ = uVar2 + -1;
    if (((RepeatedPtrFieldBase *)ptr == (RepeatedPtrFieldBase *)0x0) ||
       (uVar4 != local_60.arena_._4_4_)) break;
    if ((RepeatedPtrFieldBase *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar12 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar12 = *puVar12 | (uint)hasbits;
      }
      return (char *)(RepeatedPtrFieldBase *)ptr;
    }
    if (*(char *)&((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_ != (char)local_60.arena_._4_4_)
    {
      uVar7 = (uint)table->fast_idx_mask &
              (uint)*(ushort *)&((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_;
      if ((uVar7 & 7) == 0) {
        uVar9 = (ulong)(uVar7 & 0xfffffff8);
        pcVar11 = (char *)(**(code **)(&table[1].has_bits_offset + uVar9))
                                    (msg,ptr,ctx,
                                     (ulong)*(ushort *)
                                             &((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_ ^
                                     *(ulong *)(&table[1].fast_idx_mask + uVar9 * 2),table,hasbits);
        return pcVar11;
      }
LAB_00260d39:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
  }
  local_60.tagged_rep_or_elem_ = auVar17._0_8_;
  pcVar11 = Error(msg,(char *)ptr_00,auVar17._8_8_,(TcFieldData)offset,table,hasbits);
  return pcVar11;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint8_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}